

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::standard_reporter::do_benchmark_failure(standard_reporter *this,exception_ptr *eptr)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  long *plVar3;
  char *pcVar4;
  undefined1 auVar5 [12];
  exception_ptr local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&this->current);
  std::operator<<(poVar1," failed to run successfully\n");
  if (this->summary == false) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_20,eptr);
    auVar5 = std::rethrow_exception((exception_ptr)&local_20);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
    plVar3 = (long *)__cxa_begin_catch(auVar5._0_8_);
    if (auVar5._8_4_ == 2) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"error: ");
      pcVar4 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
      std::operator<<(poVar1,pcVar4);
    }
    else {
      std::operator<<((ostream *)&std::cerr,"unknown error");
    }
    __cxa_end_catch();
  }
  pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                     (&(this->super_reporter).os);
  std::operator<<(pbVar2,"\nbenchmark aborted\n");
  return;
}

Assistant:

void do_benchmark_failure(std::exception_ptr eptr) override {
            error_stream() << current << " failed to run successfully\n";
            if(!summary) {
                try {
                    std::rethrow_exception(eptr);
                } catch(std::exception& ex) {
                    error_stream() << "error: " << ex.what();
                } catch(...) {
                    error_stream() << "unknown error";
                }
            }
            report_stream() << "\nbenchmark aborted\n";
        }